

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

StringRef __thiscall
llvm::yaml::ScalarTraits<double,_void>::input
          (ScalarTraits<double,_void> *this,StringRef Scalar,void *param_2,double *Val)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  StringRef SVar4;
  Twine local_40;
  undefined1 local_28 [8];
  StringRef Scalar_local;
  
  Scalar_local.Data = Scalar.Data;
  local_28 = (undefined1  [8])this;
  Twine::Twine(&local_40,(StringRef *)local_28);
  bVar1 = to_float(&local_40,(double *)param_2);
  pcVar2 = "invalid floating point number";
  if (bVar1) {
    pcVar2 = (char *)0x0;
  }
  pcVar3 = (char *)0x1d;
  if (bVar1) {
    pcVar3 = (char *)0x0;
  }
  SVar4.Length = (size_t)pcVar3;
  SVar4.Data = pcVar2;
  return SVar4;
}

Assistant:

StringRef ScalarTraits<double>::input(StringRef Scalar, void *, double &Val) {
  if (to_float(Scalar, Val))
    return StringRef();
  return "invalid floating point number";
}